

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O2

ConstantValue * __thiscall
slang::ast::builtins::ArrayLocatorMethod::eval
          (ConstantValue *__return_storage_ptr__,ArrayLocatorMethod *this,EvalContext *context,
          Args *args,SourceRange param_3,SystemCallInfo *callInfo)

{
  AssociativeArray *pAVar1;
  reference ppEVar2;
  Expression *pEVar3;
  ConstantValue *pCVar4;
  variant_alternative_t<7UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar5;
  variant_alternative_t<8UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar6;
  variant_alternative_t<5UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *cont;
  pair<const_slang::ast::Expression_*,_const_slang::ast::ValueSymbol_*> pVar7;
  ConstantValue *iterVal;
  anon_class_40_5_248569b6 doFind;
  ConstantValue arr;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Kuree[P]hgdb_rtl_extern_slang_source____include_slang_ast_EvalContext_h:128:13)>
  guard;
  SVQueue results;
  ConstantValue *local_138;
  ArrayLocatorMethod *local_130;
  Expression **local_128;
  Expression *local_120;
  undefined1 *local_118;
  EvalContext *local_110;
  ArrayLocatorMethod *local_108;
  SVQueue *local_100;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_f8;
  reverse_iterator<std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
  local_d0;
  reverse_iterator<std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
  local_c8;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Kuree[P]hgdb_rtl_extern_slang_source____include_slang_ast_EvalContext_h:128:13)>
  local_c0;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_a8;
  SVQueue local_80;
  
  ppEVar2 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
            operator[](args,0);
  Expression::eval((ConstantValue *)&local_f8,*ppEVar2,context);
  if (local_f8._M_index == '\0') {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->value).
             super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
     + 0x20) = '\0';
  }
  else {
    pVar7 = CallExpression::SystemCallInfo::getIteratorInfo(callInfo);
    pEVar3 = pVar7.first;
    EvalContext::disableCaching(&local_c0,context);
    local_a8._M_index = '\0';
    pCVar4 = EvalContext::createLocal(context,pVar7.second,(ConstantValue *)&local_a8);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage(&local_a8);
    local_138 = pCVar4;
    SVQueue::SVQueue(&local_80);
    local_120 = pEVar3;
    local_110 = context;
    local_108 = this;
    local_100 = &local_80;
    if (local_f8._M_index == '\a') {
      local_118 = (undefined1 *)&local_138;
      pvVar5 = std::
               get<7ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                         ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&local_f8);
      pAVar1 = pvVar5->ptr;
      if (*(int *)&(this->super_SystemSubroutine).field_0x34 == 2) {
        local_c8.current._M_node =
             (_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>)
             &(pAVar1->
              super_map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
              )._M_t._M_impl.super__Rb_tree_header;
        local_d0.current._M_node =
             (_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>)
             (pAVar1->
             super_map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
             )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        const::{lambda(auto:1,auto:2)#1}::operator()(&local_120,&local_c8,&local_d0);
      }
      else {
        const::{lambda(auto:1,auto:2)#1}::operator()
                  (&local_120,
                   (pAVar1->
                   super_map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                   )._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                   (_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>)
                   &(pAVar1->
                    super_map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                    )._M_t._M_impl.super__Rb_tree_header);
      }
    }
    else {
      local_128 = &local_120;
      local_130 = this;
      if (local_f8._M_index == '\b') {
        local_118 = (undefined1 *)&local_138;
        pvVar6 = std::
                 get<8ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                           ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_f8);
        const::{lambda(auto:1&)#1}::operator()((_lambda_auto_1___1_ *)&local_130,pvVar6->ptr);
      }
      else {
        local_118 = (undefined1 *)&local_138;
        cont = std::
               get<5ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                         ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&local_f8);
        const::{lambda(auto:1&)#1}::operator()((_lambda_auto_1___1_ *)&local_130,cont);
      }
    }
    ConstantValue::ConstantValue(__return_storage_ptr__,&local_80);
    std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~deque
              (&local_80.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>);
    ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/EvalContext.h:128:13)>
    ::~ScopeGuard(&local_c0);
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_f8);
  return __return_storage_ptr__;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo& callInfo) const final {
        ConstantValue arr = args[0]->eval(context);
        if (!arr)
            return nullptr;

        auto [iterExpr, iterVar] = callInfo.getIteratorInfo();
        auto guard = context.disableCaching();
        auto iterVal = context.createLocal(iterVar);

        SVQueue results;
        if (arr.isMap()) {
            auto doFind = [&, ie = iterExpr](auto it, auto end) {
                for (; it != end; it++) {
                    *iterVal = it->second;
                    ConstantValue cv = ie->eval(context);
                    if (cv.isTrue()) {
                        if (isIndexed)
                            results.emplace_back(it->first);
                        else
                            results.emplace_back(it->second);

                        if (mode != All)
                            break;
                    }
                }
            };

            auto& cont = *arr.map();
            if (mode == Last)
                doFind(std::rbegin(cont), std::rend(cont));
            else
                doFind(std::begin(cont), std::end(cont));
        }
        else {
            auto doFind = [&, ie = iterExpr](auto begin, auto end) {
                for (auto it = begin; it != end; it++) {
                    *iterVal = *it;
                    ConstantValue cv = ie->eval(context);
                    if (cv.isTrue()) {
                        if (isIndexed) {
                            auto dist = std::distance(begin, it);
                            if (mode == Last)
                                dist = std::distance(begin, end) - dist - 1;

                            results.emplace_back(SVInt(32, (uint64_t)dist, true));
                        }
                        else {
                            results.emplace_back(*it);
                        }

                        if (mode != All)
                            break;
                    }
                }
            };

            auto find = [&](auto& cont) {
                if (mode == Last)
                    doFind(std::rbegin(cont), std::rend(cont));
                else
                    doFind(std::begin(cont), std::end(cont));
            };

            if (arr.isQueue())
                find(*arr.queue());
            else
                find(std::get<ConstantValue::Elements>(arr.getVariant()));
        }

        return results;
    }